

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.h
# Opt level: O2

char * FindNMEASentence(char *sentencebegin,char *str)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  
  pcVar1 = strstr(str,sentencebegin);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    sVar2 = strlen(sentencebegin);
    pcVar3 = strchr(pcVar1 + sVar2,0xd);
    if (pcVar3 == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
  }
  return pcVar1;
}

Assistant:

inline char* FindNMEASentence(char* sentencebegin, char* str)
{
	char* ptr = NULL;
	char* foundstr = NULL;

	ptr = strstr(str, sentencebegin);
	if (!ptr)
	{
		// Could not find the beginning of the sentence.
		return NULL;
	}

	// Save the position of the beginning of the sentence.
	foundstr = ptr;

	// Check if the sentence is complete.
	ptr = strstr(foundstr+strlen(sentencebegin), "\r");
	if (!ptr)
	{
		// The sentence is incomplete.
		return NULL;
	}

	return foundstr;
}